

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGPlanner.cpp
# Opt level: O2

QFunctionsDiscrete * __thiscall
PerseusBGPlanner::BackupStageAll
          (QFunctionsDiscrete *__return_storage_ptr__,PerseusBGPlanner *this,BeliefSet *S,
          QFunctionsDiscrete *Q)

{
  undefined1 *this_00;
  _func_int *p_Var1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  PlanningUnitMADPDiscrete *this_01;
  uint a;
  ulong uVar9;
  ValueFunctionPOMDPDiscrete Qalphas;
  vector<double,_std::allocator<double>_> VBalpha;
  ValueFunctionPOMDPDiscrete V;
  vector<double,_std::allocator<double>_> VB;
  AlphaVector alpha;
  AlphaVector local_158;
  GaoVectorSet Gao;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  local_b0;
  
  BeliefValue::GetValues(&VB,S,Q);
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  p_Var1 = (this->super_AlphaVectorBG)._vptr_AlphaVectorBG[-3];
  this_01 = *(PlanningUnitMADPDiscrete **)
             (p_Var1 + 8 + (long)&(this->super_AlphaVectorBG)._m_bgip.px);
  if (this_01 == (PlanningUnitMADPDiscrete *)0x0) {
    this_01 = *(PlanningUnitMADPDiscrete **)(&(this->super_AlphaVectorBG).field_0x18 + (long)p_Var1)
    ;
  }
  sVar3 = PlanningUnitMADPDiscrete::GetNrStates(this_01);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(__return_storage_ptr__,
           ((long)(Q->
                  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(Q->
                 super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&Gao);
  AlphaVector::AlphaVector(&alpha,(long)(int)sVar3);
  AlphaVectorPlanning::QFunctionsToValueFunction(&V,Q);
  this_00 = &(this->super_AlphaVectorBG).field_0x18;
  Perseus::BackupStageLeadIn(&Gao,(Perseus *)this_00,&V);
  Qalphas.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Qalphas.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  Qalphas.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar7 = (uint)((ulong)((long)VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  for (uVar8 = 0; uVar8 != (~((int)uVar7 >> 0x1f) & uVar7); uVar8 = uVar8 + 1) {
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::clear(&Qalphas);
    a = 0;
    while( true ) {
      p_Var1 = (this->super_AlphaVectorBG)._vptr_AlphaVectorBG[-3];
      lVar4 = *(long *)(p_Var1 + 8 + (long)&(this->super_AlphaVectorBG)._m_bgip.px);
      if (lVar4 == 0) {
        lVar4 = *(long *)(&(this->super_AlphaVectorBG).field_0x18 + (long)p_Var1);
      }
      uVar5 = (**(code **)(**(long **)(lVar4 + 0x30) + 0x68))();
      uVar9 = (ulong)a;
      if (uVar5 == uVar9) break;
      AlphaVectorBG::BeliefBackup
                (&local_158,&this->super_AlphaVectorBG,
                 (S->
                 super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar8],a,&Gao,&V,
                 *(BGBackupType *)&(this->super_AlphaVectorBG).field_0xe0);
      AlphaVector::operator=(&alpha,&local_158);
      AlphaVector::~AlphaVector(&local_158);
      bVar2 = AlphaVectorPlanning::VectorIsInValueFunction
                        (&alpha,(__return_storage_ptr__->
                                super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar9);
      if (!bVar2) {
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                  ((__return_storage_ptr__->
                   super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar9,&alpha);
      }
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back(&Qalphas,&alpha);
      a = a + 1;
    }
    if (*(int *)&(this->super_AlphaVectorBG).field_0x28 != 0) {
      BeliefValue::GetValues((vector<double,_std::allocator<double>_> *)&local_158,S,&Qalphas);
      std::vector<double,_std::allocator<double>_>::_M_move_assign(&VBalpha,&local_158);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_158);
      poVar6 = std::operator<<((ostream *)&std::cout,"Added vectors for ");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,(int)uVar8);
      std::operator<<(poVar6," (V ");
      poVar6 = std::ostream::_M_insert<double>
                         (VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar8]);
      poVar6 = std::operator<<(poVar6,")");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array(&local_b0,&Gao);
  Perseus::BackupStageLeadOut((Perseus *)this_00,&local_b0);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(&local_b0);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&Qalphas);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(&Gao);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&V);
  AlphaVector::~AlphaVector(&alpha);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&VBalpha.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&VB.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

QFunctionsDiscrete
PerseusBGPlanner::BackupStageAll(const BeliefSet &S,
                                 const QFunctionsDiscrete &Q) const
{
    vector<double> VB=BeliefValue::GetValues(S,Q),
        VBalpha;

    int nrB=VB.size(),
        nrS=GetPU()->GetNrStates();
    QFunctionsDiscrete Q1(Q.size());
    AlphaVector alpha(nrS);

    ValueFunctionPOMDPDiscrete V=QFunctionsToValueFunction(Q);
    GaoVectorSet Gao=BackupStageLeadIn(V);

    ValueFunctionPOMDPDiscrete Qalphas;

    for(int k=0;k<nrB;++k)
    {
        Qalphas.clear();
        for(unsigned int a=0;a!=GetPU()->GetNrJointActions();++a)
        {
            // backup the belief
            alpha=BeliefBackup(*S[k],a,Gao,V,_m_backupType);
           
            // add alpha to Q1
            if(!VectorIsInValueFunction(alpha,Q1[a]))
                Q1[a].push_back(alpha);
            Qalphas.push_back(alpha);
        }

        if(GetVerbose())
        {
            VBalpha=BeliefValue::GetValues(S,Qalphas);
            cout << "Added vectors for " << k << " (V " << VBalpha[k] 
                 << ")" << endl;
        }
    }

    BackupStageLeadOut(Gao);

    return(Q1);
}